

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML88591Transcoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XML88591Transcoder::transcodeTo
          (XML88591Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts options)

{
  XMLCh XVar1;
  MemoryManager *pMVar2;
  TranscodingException *this_00;
  XMLCh *text2;
  XMLSize_t local_a8;
  XMLCh local_88 [4];
  XMLCh tmpBuf [17];
  XMLByte *local_58;
  XMLByte *destPtr;
  XMLCh *srcEnd;
  XMLCh *srcPtr;
  XMLSize_t countToDo;
  XMLSize_t *charsEaten_local;
  XMLSize_t maxBytes_local;
  XMLByte *toFill_local;
  XMLSize_t srcCount_local;
  XMLCh *srcData_local;
  XML88591Transcoder *this_local;
  
  local_a8 = maxBytes;
  if (srcCount < maxBytes) {
    local_a8 = srcCount;
  }
  local_58 = toFill;
  srcEnd = srcData;
  while( true ) {
    while( true ) {
      if (srcData + local_a8 <= srcEnd) {
        *charsEaten = local_a8;
        return local_a8;
      }
      if (0xff < (ushort)*srcEnd) break;
      *local_58 = (XMLByte)*srcEnd;
      local_58 = local_58 + 1;
      srcEnd = srcEnd + 1;
    }
    if (options == UnRep_Throw) break;
    *local_58 = '\x1a';
    srcEnd = srcEnd + 1;
    local_58 = local_58 + 1;
  }
  XVar1 = *srcEnd;
  pMVar2 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
  XMLString::binToText((uint)(ushort)XVar1,local_88,0x10,0x10,pMVar2);
  this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
  text2 = XMLTranscoder::getEncodingName(&this->super_XMLTranscoder);
  pMVar2 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
  TranscodingException::TranscodingException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XML88591Transcoder.cpp"
             ,0x7f,Trans_Unrepresentable,local_88,text2,(XMLCh *)0x0,(XMLCh *)0x0,pMVar2);
  __cxa_throw(this_00,&TranscodingException::typeinfo,TranscodingException::~TranscodingException);
}

Assistant:

XMLSize_t
XML88591Transcoder::transcodeTo(const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts       options)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output bytes and the number of chars in the source.
    //
    const XMLSize_t countToDo = srcCount < maxBytes ? srcCount : maxBytes;

    //
    //  Loop through the bytes to do and convert over each byte. Its just
    //  a downcast of the wide char, checking for unrepresentable chars.
    //
    const XMLCh*    srcPtr  = srcData;
    const XMLCh*    srcEnd  = srcPtr + countToDo;
    XMLByte*        destPtr = toFill;
    while (srcPtr < srcEnd)
    {
        // If its legal, take it and jump back to top
        if (*srcPtr < 256)
        {
            *destPtr++ = XMLByte(*srcPtr++);
            continue;
        }

        //
        //  Its not representable so use a replacement char. According to
        //  the options, either throw or use the replacement.
        //
        if (options == UnRep_Throw)
        {
            XMLCh tmpBuf[17];
            XMLString::binToText((unsigned int)*srcPtr, tmpBuf, 16, 16, getMemoryManager());
            ThrowXMLwithMemMgr2
            (
                TranscodingException
                , XMLExcepts::Trans_Unrepresentable
                , tmpBuf
                , getEncodingName()
                , getMemoryManager()
            );
        }
        *destPtr++ = 0x1A;
        srcPtr++;
    }

    // Set the chars eaten
    charsEaten = countToDo;

    // Return the bytes we transcoded
    return countToDo;
}